

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall
boost::runtime::enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>::
enum_parameter<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const,boost::runtime::(anonymous_namespace)::enum_values_t,std::initializer_list<std::pair<boost::unit_test::basic_cstring<char_const>const,boost::unit_test::output_format>>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::output_format_const,boost::runtime::(anonymous_namespace)::default_value_t,boost::unit_test::output_format_const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>>>
          (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> *this,
          cstring name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>_>
          *m)

{
  string *psVar1;
  ref_type piVar2;
  iterator __x;
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> *local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> *local_d0;
  enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> *local_c8;
  string *local_c0;
  iterator local_b8;
  iterator local_b0;
  cstring local_a8;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined8 local_5f;
  undefined4 local_57;
  undefined2 local_53;
  enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> local_51;
  cstring local_50;
  cstring local_40;
  
  *(undefined ***)this = &PTR__basic_param_001c9fb0;
  psVar1 = (string *)(this + 8);
  local_118 = this + 0x18;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 8) =
       local_118;
  std::__cxx11::string::_M_construct<char_const*>(psVar1);
  local_130 = 0;
  local_128 = 0;
  local_138 = &local_128;
  local_c0 = psVar1;
  if ((m->
      super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
      ).
      super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
      .
      super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
      .
      super_named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
      .m_erased == true) {
    nfp::nil::inst();
    unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
              ((access_to_invalid_parameter *)&local_110);
  }
  local_b0 = name.m_begin;
  std::__cxx11::string::_M_replace
            ((ulong)&local_138,0,(char *)0x0,
             (ulong)((m->
                     super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
                     ).
                     super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
                     .
                     super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
                     .
                     super_named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
                    .m_value)->m_begin);
  local_c8 = this + 0x38;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x28)
       = local_c8;
  if (local_138 == &local_128) {
    *(ulong *)local_c8 = CONCAT71(uStack_127,local_128);
    *(undefined8 *)(this + 0x40) = uStack_120;
  }
  else {
    *(undefined1 **)(this + 0x28) = local_138;
    *(ulong *)(this + 0x38) = CONCAT71(uStack_127,local_128);
  }
  *(undefined8 *)(this + 0x30) = local_130;
  local_130 = 0;
  local_128 = 0;
  local_108 = 0;
  local_100 = 0;
  local_110 = &local_100;
  if ((m->m_param).m_erased == true) {
    local_138 = &local_128;
    nfp::nil::inst();
    unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
              ((access_to_invalid_parameter *)&local_f0);
  }
  local_138 = &local_128;
  local_b8 = name.m_end;
  std::__cxx11::string::_M_replace
            ((ulong)&local_110,0,(char *)0x0,(ulong)((m->m_param).m_value)->m_begin);
  local_d0 = this + 0x58;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x48)
       = local_d0;
  if (local_110 == &local_100) {
    *(ulong *)local_d0 = CONCAT71(uStack_ff,local_100);
    *(undefined8 *)(this + 0x60) = uStack_f8;
  }
  else {
    *(undefined1 **)(this + 0x48) = local_110;
    *(ulong *)(this + 0x58) = CONCAT71(uStack_ff,local_100);
  }
  *(undefined8 *)(this + 0x50) = local_108;
  local_108 = 0;
  local_100 = 0;
  local_e8 = 0;
  local_e0 = 0;
  local_f0 = &local_e0;
  if ((m->
      super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
      ).
      super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
      .
      super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
      .m_param.m_erased == true) {
    local_110 = &local_100;
    nfp::nil::inst();
    unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
              ((access_to_invalid_parameter *)&local_70);
  }
  local_110 = &local_100;
  std::__cxx11::string::_M_replace
            ((ulong)&local_f0,0,(char *)0x0,
             (ulong)((m->
                     super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
                     ).
                     super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
                     .
                     super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
                     .m_param.m_value)->m_begin);
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x68)
       = this + 0x78;
  if (local_f0 == &local_e0) {
    *(ulong *)(this + 0x78) = CONCAT71(uStack_df,local_e0);
    *(undefined8 *)(this + 0x80) = uStack_d8;
  }
  else {
    *(undefined1 **)(this + 0x68) = local_f0;
    *(ulong *)(this + 0x78) = CONCAT71(uStack_df,local_e0);
  }
  *(undefined8 *)(this + 0x70) = local_e8;
  local_e8 = 0;
  local_e0 = 0;
  local_70 = &local_60;
  *(enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0> **)(this + 0x88)
       = this + 0x98;
  this[0x98] = (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>)0x0;
  *(undefined8 *)(this + 0x99) = local_5f;
  *(undefined4 *)(this + 0xa1) = local_57;
  *(undefined2 *)(this + 0xa5) = local_53;
  this[0xa7] = local_51;
  *(undefined8 *)(this + 0x90) = 0;
  local_68 = 0;
  local_60 = 0;
  *(undefined2 *)(this + 0xa8) = 1;
  this[0xaa] = (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>)0x0;
  this[0xab] = (enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>)
               ((m->
                super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
                ).
                super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
                .m_param.m_erased ^ 1);
  local_90.super_function_base.vtable = (vtable_base *)0x0;
  *(undefined8 *)(this + 0xb0) = 0;
  local_f0 = &local_e0;
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::move_assign
            ((function1<void,_boost::unit_test::basic_cstring<const_char>_> *)(this + 0xb0),
             &local_90);
  function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1(&local_90);
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  local_a8.m_begin = help_prefix;
  local_a8.m_end = DAT_001cdc28;
  local_40.m_begin = local_b0;
  local_40.m_end = local_b8;
  local_50.m_begin = ":";
  local_50.m_end = "";
  basic_param::add_cla_id_impl((basic_param *)this,&local_a8,&local_40,&local_50,false,true);
  *(undefined ***)this = &PTR__parameter_001ca5d8;
  if ((m->
      super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
      ).m_param.m_erased != true) {
    std::
    map<boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
    ::map((map<boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_>
           *)(this + 0xe8),
          *(m->
           super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
           ).m_param.m_value,(less<boost::unit_test::basic_cstring<const_char>_> *)&local_138,
          (allocator_type *)&local_110);
    *(undefined4 *)(this + 0x118) = 0;
    if ((m->
        super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
        ).
        super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
        .m_param.m_erased == true) {
      nfp::nil::inst();
      unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
                ((access_to_invalid_parameter *)&local_138);
    }
    *(output_format *)(this + 0x11c) =
         *(m->
          super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
          ).
          super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
          .m_param.m_value;
    *(undefined ***)this = &PTR__enum_parameter_001ca550;
    *(undefined8 *)(this + 0x120) = 0;
    *(undefined8 *)(this + 0x128) = 0;
    *(undefined8 *)(this + 0x130) = 0;
    if ((m->
        super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
        ).m_param.m_erased != true) {
      piVar2 = (m->
               super_named_parameter_combine<boost::nfp::named_parameter<const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>,_boost::runtime::(anonymous_namespace)::enum_values_t,_const_std::initializer_list<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::output_format>_>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::output_format,_boost::runtime::(anonymous_namespace)::default_value_t,_const_boost::unit_test::output_format_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>_>
               ).m_param.m_value;
      if (piVar2->_M_len != 0) {
        __x = piVar2->_M_array;
        do {
          std::
          vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
          ::push_back((vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
                       *)(this + 0x120),&__x->first);
          __x = __x + 1;
        } while (__x != piVar2->_M_array + piVar2->_M_len);
      }
      return;
    }
    nfp::nil::inst();
    unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
              ((access_to_invalid_parameter *)&local_138);
  }
  nfp::nil::inst();
  unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
            ((access_to_invalid_parameter *)&local_138);
}

Assistant:

enum_parameter( cstring name, Modifiers const& m )
#endif
    : base( name, m )
    {
#ifdef BOOST_TEST_CLA_NEW_API
        auto const& values = m[enum_values<EnumType>::value];
        auto it = values.begin();
#else
        std::vector<std::pair<cstring, EnumType> > const& values = m[enum_values<EnumType>::value];
        typename std::vector<std::pair<cstring, EnumType> >::const_iterator it = values.begin();
#endif
        while( it != values.end() ) {
            m_valid_names.push_back( it->first );
            ++it;
        }
    }